

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_on_exchange(ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  ptls_iovec_t vec;
  EC_GROUP *group_00;
  ptls_iovec_t *in_RCX;
  EC_POINT *in_RDX;
  int in_ESI;
  EC_GROUP *in_RDI;
  int ret;
  EC_POINT *peer_point;
  EC_GROUP *group;
  st_x9_62_keyex_context_t *ctx;
  int local_44;
  EC_POINT *point;
  uint8_t *puVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  puVar1 = *(uint8_t **)in_RDI;
  group_00 = EC_KEY_get0_group(*(EC_KEY **)(puVar1 + 0x28));
  point = (EC_POINT *)0x0;
  if (in_RDX == (EC_POINT *)0x0) {
    local_44 = 0;
  }
  else {
    vec.len = (size_t)in_RDX;
    vec.base = puVar1;
    point = x9_62_decode_point((EC_GROUP *)group_00,vec,(BN_CTX *)0x0);
    if (point == (EC_POINT *)0x0) {
      local_44 = 0x32;
    }
    else {
      local_44 = ecdh_calc_secret(in_RCX,in_RDI,(EC_KEY *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0)
                                  ,in_RDX);
    }
  }
  if (point != (EC_POINT *)0x0) {
    EC_POINT_free((EC_POINT *)point);
  }
  if (in_ESI != 0) {
    x9_62_free_context((st_x9_62_keyex_context_t *)0x106976);
    *(long *)in_RDI = 0;
  }
  return local_44;
}

Assistant:

static int x9_62_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_x9_62_keyex_context_t *ctx = (struct st_x9_62_keyex_context_t *)*_ctx;
    const EC_GROUP *group = EC_KEY_get0_group(ctx->privkey);
    EC_POINT *peer_point = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    if ((peer_point = x9_62_decode_point(group, peerkey, ctx->bn_ctx)) == NULL) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    if ((ret = ecdh_calc_secret(secret, group, ctx->privkey, peer_point)) != 0)
        goto Exit;

Exit:
    if (peer_point != NULL)
        EC_POINT_free(peer_point);
    if (release) {
        x9_62_free_context(ctx);
        *_ctx = NULL;
    }
    return ret;
}